

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTests.cpp
# Opt level: O3

int __thiscall glcts::TessellationShaderTests::init(TessellationShaderTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TessellationShaderVertexOrdering *this_00;
  TessellationShaderVertexSpacing *this_01;
  TestNode *node;
  TessellationShadersIsolines *this_02;
  TessellationShaderProgramInterfaces *this_03;
  TessellationShaderPropertiesProgramObject *this_04;
  TessellationShaderXFB *this_05;
  TessellationShaderMaxPatchVertices *this_06;
  TessellationShaderPrimitiveCoverage *this_07;
  
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroupBase).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"vertex",fixed_sample_locations_values + 1);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021028b0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)(this->super_TestCaseGroupBase).m_extParams;
  this_00 = (TessellationShaderVertexOrdering *)operator_new(0x300);
  TessellationShaderVertexOrdering::TessellationShaderVertexOrdering
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
  this_01 = (TessellationShaderVertexSpacing *)operator_new(0x2d8);
  TessellationShaderVertexSpacing::TessellationShaderVertexSpacing
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroupBase).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"single",fixed_sample_locations_values + 1);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021028b0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_testCtx = (TestContext *)(this->super_TestCaseGroupBase).m_extParams;
  node = (TestNode *)operator_new(0x2b0);
  TessellationShaderPropertiesDefaultContextWideValues::
  TessellationShaderPropertiesDefaultContextWideValues
            ((TessellationShaderPropertiesDefaultContextWideValues *)node,
             (this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,node);
  this_02 = (TessellationShadersIsolines *)operator_new(0x328);
  TessellationShadersIsolines::TessellationShadersIsolines
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_02);
  this_03 = (TessellationShaderProgramInterfaces *)operator_new(0x2c8);
  TessellationShaderProgramInterfaces::TessellationShaderProgramInterfaces
            (this_03,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_03);
  this_04 = (TessellationShaderPropertiesProgramObject *)operator_new(0x2c8);
  TessellationShaderPropertiesProgramObject::TessellationShaderPropertiesProgramObject
            (this_04,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_04);
  this_05 = (TessellationShaderXFB *)operator_new(0x2e8);
  TessellationShaderXFB::TessellationShaderXFB
            (this_05,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_05);
  this_06 = (TessellationShaderMaxPatchVertices *)operator_new(0x340);
  TessellationShaderMaxPatchVertices::TessellationShaderMaxPatchVertices
            (this_06,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_06);
  this_07 = (TessellationShaderPrimitiveCoverage *)operator_new(0x2f0);
  TessellationShaderPrimitiveCoverage::TessellationShaderPrimitiveCoverage
            (this_07,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_07);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderQuadsTests::TessellationShaderQuadsTests
            ((TessellationShaderQuadsTests *)pTVar2,(this->super_TestCaseGroupBase).m_context,
             extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderTCTETests::TessellationShaderTCTETests
            ((TessellationShaderTCTETests *)pTVar2,(this->super_TestCaseGroupBase).m_context,
             extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderTessellationTests::TessellationShaderTessellationTests
            ((TessellationShaderTessellationTests *)pTVar2,(this->super_TestCaseGroupBase).m_context
             ,extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderTrianglesTests::TessellationShaderTrianglesTests
            ((TessellationShaderTrianglesTests *)pTVar2,(this->super_TestCaseGroupBase).m_context,
             extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderPointsTests::TessellationShaderPointsTests
            ((TessellationShaderPointsTests *)pTVar2,(this->super_TestCaseGroupBase).m_context,
             extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderBarrierTests::TessellationShaderBarrierTests
            ((TessellationShaderBarrierTests *)pTVar2,(this->super_TestCaseGroupBase).m_context,
             extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderErrors::TessellationShaderErrors
            ((TessellationShaderErrors *)pTVar2,(this->super_TestCaseGroupBase).m_context,extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  TessellationShaderInvarianceTests::TessellationShaderInvarianceTests
            ((TessellationShaderInvarianceTests *)pTVar2,(this->super_TestCaseGroupBase).m_context,
             extParams);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void TessellationShaderTests::init(void)
{
	TestCaseGroupBase* vertexGroup = new TestCaseGroupBase(m_context, m_extParams, "vertex", "");
	vertexGroup->addChild(new TessellationShaderVertexOrdering(m_context, m_extParams));
	vertexGroup->addChild(new TessellationShaderVertexSpacing(m_context, m_extParams));
	addChild(vertexGroup);

	TestCaseGroupBase* singleGroup = new TestCaseGroupBase(m_context, m_extParams, "single", "");

	singleGroup->addChild(new TessellationShaderPropertiesDefaultContextWideValues(m_context, m_extParams));

	singleGroup->addChild(new TessellationShadersIsolines(m_context, m_extParams));

	singleGroup->addChild(new TessellationShaderProgramInterfaces(m_context, m_extParams));

	singleGroup->addChild(new TessellationShaderPropertiesProgramObject(m_context, m_extParams));
	singleGroup->addChild(new TessellationShaderXFB(m_context, m_extParams));
	singleGroup->addChild(new TessellationShaderMaxPatchVertices(m_context, m_extParams));
	singleGroup->addChild(new TessellationShaderPrimitiveCoverage(m_context, m_extParams));
	addChild(singleGroup);

	addChild(new TessellationShaderQuadsTests(m_context, m_extParams));
	addChild(new TessellationShaderTCTETests(m_context, m_extParams));
	addChild(new TessellationShaderTessellationTests(m_context, m_extParams));
	addChild(new TessellationShaderTrianglesTests(m_context, m_extParams));
	addChild(new TessellationShaderPointsTests(m_context, m_extParams));
	addChild(new TessellationShaderBarrierTests(m_context, m_extParams));
	addChild(new TessellationShaderErrors(m_context, m_extParams));
	addChild(new TessellationShaderInvarianceTests(m_context, m_extParams));
}